

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O3

REF_STATUS ref_shard_extract_tet(REF_GRID ref_grid,REF_CELL *ref_cell_ptr)

{
  REF_CELL ref_cell;
  uint uVar1;
  REF_STATUS RVar2;
  undefined8 uVar3;
  REF_CELL pRVar4;
  char *pcVar5;
  REF_INT RVar6;
  int cell;
  REF_INT nodes [27];
  REF_INT aRStack_98 [28];
  
  uVar1 = ref_cell_deep_copy(ref_cell_ptr,ref_grid->cell[8]);
  if (uVar1 == 0) {
    ref_cell = *ref_cell_ptr;
    pRVar4 = ref_grid->cell[9];
    if (0 < pRVar4->max) {
      RVar6 = 0;
      do {
        RVar2 = ref_cell_nodes(pRVar4,RVar6,aRStack_98);
        if (RVar2 == 0) {
          uVar1 = ref_shard_add_pyr_as_tet(ref_grid->node,ref_cell,aRStack_98,0);
          if (uVar1 != 0) {
            pcVar5 = "converts pyr to tets";
            uVar3 = 0x48c;
            goto LAB_0014926d;
          }
        }
        RVar6 = RVar6 + 1;
        pRVar4 = ref_grid->cell[9];
      } while (RVar6 < pRVar4->max);
    }
    pRVar4 = ref_grid->cell[10];
    if (0 < pRVar4->max) {
      RVar6 = 0;
      do {
        RVar2 = ref_cell_nodes(pRVar4,RVar6,aRStack_98);
        if (RVar2 == 0) {
          uVar1 = ref_shard_add_pri_as_tet(ref_grid->node,ref_cell,aRStack_98,0);
          if (uVar1 != 0) {
            pcVar5 = "converts pri to tets";
            uVar3 = 0x492;
            goto LAB_0014926d;
          }
        }
        RVar6 = RVar6 + 1;
        pRVar4 = ref_grid->cell[10];
      } while (RVar6 < pRVar4->max);
    }
    pRVar4 = ref_grid->cell[0xb];
    if (0 < pRVar4->max) {
      cell = 0;
      do {
        RVar2 = ref_cell_nodes(pRVar4,cell,aRStack_98);
        if (RVar2 == 0) {
          uVar1 = ref_shard_add_hex_as_tet(ref_grid->node,ref_cell,aRStack_98);
          if (uVar1 != 0) {
            pcVar5 = "converts hex to tets";
            uVar3 = 0x497;
            goto LAB_0014926d;
          }
        }
        cell = cell + 1;
        pRVar4 = ref_grid->cell[0xb];
      } while (cell < pRVar4->max);
    }
    uVar1 = 0;
  }
  else {
    pcVar5 = "deep tri copy";
    uVar3 = 0x485;
LAB_0014926d:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",uVar3,
           "ref_shard_extract_tet",(ulong)uVar1,pcVar5);
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_shard_extract_tet(REF_GRID ref_grid,
                                         REF_CELL *ref_cell_ptr) {
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_CELL ref_cell;
  REF_BOOL check_volume = REF_FALSE;
  REF_BOOL check_faces = REF_FALSE;

  if (check_faces)
    RSS(ref_shard_verify_faces(ref_grid, ref_grid_tet(ref_grid)), "orig tet");

  RSS(ref_cell_deep_copy(ref_cell_ptr, ref_grid_tet(ref_grid)),
      "deep tri copy");
  ref_cell = *ref_cell_ptr;
  if (check_faces)
    RSS(ref_shard_verify_faces(ref_grid, ref_cell), "deep copy tet");
  each_ref_cell_valid_cell_with_nodes(ref_grid_pyr(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pyr_as_tet(ref_grid_node(ref_grid), ref_cell, nodes,
                                 check_volume),
        "converts pyr to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add pyr");
  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    RSS(ref_shard_add_pri_as_tet(ref_grid_node(ref_grid), ref_cell, nodes,
                                 check_volume),
        "converts pri to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add pri");
  each_ref_cell_valid_cell_with_nodes(ref_grid_hex(ref_grid), cell, nodes) {
    RSS(ref_shard_add_hex_as_tet(ref_grid_node(ref_grid), ref_cell, nodes),
        "converts hex to tets");
  }
  if (check_faces) RSS(ref_shard_verify_faces(ref_grid, ref_cell), "add hex");

  return REF_SUCCESS;
}